

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptionsTests.cpp
# Opt level: O1

void anon_unknown.dwarf_153ae6::checkSameType(type_info *type1,type_info *type2,string *message)

{
  code *pcVar1;
  double dVar2;
  char extraout_AL;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Da_01;
  undefined4 extraout_XMM0_Da_02;
  undefined4 uVar3;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  undefined4 uVar4;
  ContextScope<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_approvals[P]ApprovalTests_tests_DocTest_Tests_core_OptionsTests_cpp:18:9)>
  DOCTEST_CAPTURE_4;
  ResultBuilder DOCTEST_RB;
  allocator<char> local_156;
  allocator<char> local_155;
  ExpressionDecomposer local_154;
  char *local_150;
  undefined8 local_148;
  char local_140;
  undefined7 uStack_13f;
  undefined8 uStack_138;
  anon_union_24_2_13149d16_for_String_3 local_130;
  undefined8 uStack_118;
  Enum local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  Result local_e8;
  ContextScope<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_approvals[P]ApprovalTests_tests_DocTest_Tests_core_OptionsTests_cpp:18:9)>
  local_c8;
  ResultBuilder local_b0;
  
  doctest::detail::ContextScopeBase::ContextScopeBase(&local_c8.super_ContextScopeBase);
  local_c8.super_ContextScopeBase.super_IContextScope._vptr_IContextScope =
       (_func_int **)&PTR__ContextScope_001d23c8;
  local_c8.lambda_.message = message;
  doctest::String::String((String *)&local_130.data,"");
  doctest::detail::ResultBuilder::ResultBuilder
            (&local_b0,DT_CHECK,
             "/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/tests/DocTest_Tests/core/OptionsTests.cpp"
             ,0x12,"std::string(type1.name()) == std::string(type2.name())","",
             (String *)&local_130.data);
  doctest::String::~String((String *)&local_130.data);
  doctest::detail::ExpressionDecomposer::ExpressionDecomposer(&local_154,DT_CHECK);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_150,*(char **)(type1 + 8) + (**(char **)(type1 + 8) == '*'),&local_155
            );
  if (local_150 == &local_140) {
    uStack_118 = uStack_138;
    local_130.data.ptr = local_130.buf + 0x10;
  }
  else {
    local_130.data.ptr = local_150;
  }
  local_130._17_7_ = uStack_13f;
  local_130.buf[0x10] = local_140;
  local_130._8_8_ = local_148;
  local_148 = 0;
  local_140 = '\0';
  local_110 = local_154.m_at;
  local_150 = &local_140;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_108,*(char **)(type2 + 8) + (**(char **)(type2 + 8) == '*'),&local_156
            );
  doctest::detail::Expression_lhs<std::__cxx11::string>::operator==
            (&local_e8,(Expression_lhs<std::__cxx11::string> *)&local_130.data,&local_108);
  doctest::detail::ResultBuilder::setResult(&local_b0,&local_e8);
  doctest::String::~String(&local_e8.m_decomp);
  uVar3 = extraout_XMM0_Da;
  uVar4 = extraout_XMM0_Db;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != &local_108.field_2) {
    operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
    uVar3 = extraout_XMM0_Da_00;
    uVar4 = extraout_XMM0_Db_00;
  }
  if (local_130.data.ptr != local_130.buf + 0x10) {
    operator_delete(local_130.data.ptr,local_130._16_8_ + 1);
    uVar3 = extraout_XMM0_Da_01;
    uVar4 = extraout_XMM0_Db_01;
  }
  if (local_150 != &local_140) {
    operator_delete(local_150,CONCAT71(uStack_13f,local_140) + 1);
    uVar3 = extraout_XMM0_Da_02;
    uVar4 = extraout_XMM0_Db_02;
  }
  dVar2 = doctest::detail::ResultBuilder::log(&local_b0,(double)CONCAT44(uVar4,uVar3));
  if (extraout_AL != '\0') {
    pcVar1 = (code *)swi(3);
    (*pcVar1)(SUB84(dVar2,0));
    return;
  }
  doctest::detail::ResultBuilder::react(&local_b0);
  doctest::String::~String((String *)&local_b0.super_AssertData.m_exception_string);
  doctest::String::~String(&local_b0.super_AssertData.m_decomp);
  doctest::String::~String(&local_b0.super_AssertData.m_exception);
  doctest::detail::
  ContextScope<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/tests/DocTest_Tests/core/OptionsTests.cpp:18:9)>
  ::~ContextScope(&local_c8);
  return;
}

Assistant:

void checkSameType(std::type_info const& type1,
                       std::type_info const& type2,
                       const std::string& message)
    {
        CHECK_MESSAGE(std::string(type1.name()) == std::string(type2.name()), message);
    }